

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

EqualsTypeClauseSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::EqualsTypeClauseSyntax,slang::parsing::Token,slang::syntax::DataTypeSyntax&>
          (BumpAllocator *this,Token *args,DataTypeSyntax *args_1)

{
  Token equals;
  EqualsTypeClauseSyntax *pEVar1;
  BumpAllocator *in_RDX;
  Info *in_RSI;
  size_t in_stack_ffffffffffffffd8;
  size_t in_stack_ffffffffffffffe0;
  
  pEVar1 = (EqualsTypeClauseSyntax *)
           allocate(in_RDX,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  equals.info = in_RSI;
  equals._0_8_ = in_RDX;
  slang::syntax::EqualsTypeClauseSyntax::EqualsTypeClauseSyntax
            ((EqualsTypeClauseSyntax *)in_RSI->location,equals,(DataTypeSyntax *)in_RSI->rawTextPtr)
  ;
  return pEVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }